

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry * Curl_fetch_addr(connectdata *conn,char *hostname,int port)

{
  Curl_easy *data;
  Curl_dns_entry *pCVar1;
  Curl_easy *conn_00;
  
  data = conn->data;
  conn_00 = data;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    conn_00 = conn->data;
  }
  pCVar1 = fetch_addr((connectdata *)conn_00,hostname,port);
  if (pCVar1 != (Curl_dns_entry *)0x0) {
    pCVar1->inuse = pCVar1->inuse + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  return pCVar1;
}

Assistant:

struct Curl_dns_entry *
Curl_fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  struct Curl_easy *data = conn->data;
  struct Curl_dns_entry *dns = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns)
    dns->inuse++; /* we use it! */

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  return dns;
}